

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderU.h
# Opt level: O1

void __thiscall
chrono::ChLoaderUdistributed::ChLoaderUdistributed
          (ChLoaderUdistributed *this,shared_ptr<chrono::ChLoadableU> *mloadable)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (mloadable->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (mloadable->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_ChLoaderU).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    (this->super_ChLoaderU).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    (this->super_ChLoaderU).super_ChLoader._vptr_ChLoader = (_func_int **)&PTR__ChLoaderU_00138b98;
    (this->super_ChLoaderU).loadable.
    super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_ChLoaderU).loadable.
    super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (this->super_ChLoaderU).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    (this->super_ChLoaderU).super_ChLoader.Q.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    (this->super_ChLoaderU).super_ChLoader._vptr_ChLoader = (_func_int **)&PTR__ChLoaderU_00138b98;
    (this->super_ChLoaderU).loadable.
    super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_ChLoaderU).loadable.
    super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00125ebc;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00125ebc:
  (this->super_ChLoaderU).super_ChLoader._vptr_ChLoader = (_func_int **)&PTR__ChLoaderU_00138e78;
  return;
}

Assistant:

ChLoaderUdistributed(std::shared_ptr<ChLoadableU> mloadable) : ChLoaderU(mloadable) {}